

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test::
~RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test
          (RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this)

{
  RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this_local;
  
  ~RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, NaturalGrowthOnArenasReuseBlocks) {
  Arena arena;
  std::vector<RepeatedField<int>*> values;

  static constexpr int kNumFields = 100;
  static constexpr int kNumElems = 1000;
  for (int i = 0; i < kNumFields; ++i) {
    values.push_back(Arena::Create<RepeatedField<int>>(&arena));
    auto& field = *values.back();
    for (int j = 0; j < kNumElems; ++j) {
      field.Add(j);
    }
  }

  size_t expected = values.size() * values[0]->Capacity() * sizeof(int);
  // Use a 2% slack for other overhead. If we were not reusing the blocks, the
  // actual value would be ~2x the expected.
  EXPECT_THAT(arena.SpaceUsed(), AllOf(Ge(expected), Le(1.02 * expected)));
}